

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCluster.cpp
# Opt level: O1

string * __thiscall
TypeCluster::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,TypeCluster *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  _Rb_tree_header *p_Var3;
  stringstream ss;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"tcI",3);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"={ ",3);
  p_Var2 = (this->_m_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->_m_types)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    while( true ) {
      (**(code **)(**(long **)(p_Var2 + 1) + 0x18))(&local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1d8,local_1d0);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      if ((_Rb_tree_header *)p_Var2 == p_Var3) break;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," | ",3);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8," }",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string TypeCluster::SoftPrint() const
{
    stringstream ss;
    ss << "tcI"<<_m_i<<"={ ";

    type_ci it = _m_types.begin();
    type_ci last = _m_types.end();

    while(it != last)
    {
        ss << (*it)->SoftPrint();        
        it++;
        if(it != last)
            ss << " | ";       
    }
    ss << " }";
    return(ss.str());
}